

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPM2B_PUBLIC_Unmarshal(TPM2B_PUBLIC *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  int iVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT16_Unmarshal(&target->size,buffer,size);
  if (TVar2 == 0) {
    if (target->size == 0) {
      TVar2 = 0x95;
    }
    else {
      iVar1 = *size;
      TVar2 = TPMT_PUBLIC_Unmarshal(&target->publicArea,buffer,size,flag);
      if ((TVar2 == 0) && (TVar2 = 0x95, iVar1 - *size == (uint)target->size)) {
        TVar2 = 0;
      }
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPM2B_PUBLIC_Unmarshal(TPM2B_PUBLIC *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    INT32    startSize;
    result = UINT16_Unmarshal((UINT16 *)&(target->size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    // if size is zero, then the required structure is missing
    if(target->size == 0)
        return TPM_RC_SIZE;
    startSize = *size;
    result = TPMT_PUBLIC_Unmarshal((TPMT_PUBLIC *)&(target->publicArea), buffer, size, flag);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(target->size != (startSize - *size)) return TPM_RC_SIZE;
    return TPM_RC_SUCCESS;
}